

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseTracking::ITracker::~ITracker(ITracker *this)

{
  this->_vptr_ITracker = (_func_int **)&PTR__ITracker_00198f20;
  std::__cxx11::string::~string((string *)&this->m_nameAndLocation);
  return;
}

Assistant:

ITracker::~ITracker() = default;